

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderTextureFunctionTests.cpp
# Opt level: O2

string * __thiscall
deqp::gles3::Functional::TextureSizeCase::genVertexShader_abi_cxx11_
          (string *__return_storage_ptr__,TextureSizeCase *this)

{
  ostream *poVar1;
  ostringstream vert;
  ostream local_190;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_190);
  poVar1 = std::operator<<(&local_190,"#version 300 es\n");
  std::operator<<(poVar1,"in highp vec4 a_position;\n");
  if (this->m_isVertexCase == true) {
    std::operator<<(&local_190,"out mediump vec4 v_color;\n");
    poVar1 = std::operator<<(&local_190,"uniform highp ");
    poVar1 = std::operator<<(poVar1,this->m_samplerTypeStr);
    std::operator<<(poVar1," u_sampler;\n");
    poVar1 = std::operator<<(&local_190,"uniform highp ivec");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->m_has3DSize | 2);
    std::operator<<(poVar1," u_texSize;\n");
    std::operator<<(&local_190,"uniform highp int u_lod;\n");
  }
  std::operator<<(&local_190,"void main()\n{\n");
  if (this->m_isVertexCase == true) {
    std::operator<<(&local_190,
                    "\tv_color = (textureSize(u_sampler, u_lod) == u_texSize ? vec4(1.0, 1.0, 1.0, 1.0) : vec4(0.0, 0.0, 0.0, 1.0));\n"
                   );
  }
  poVar1 = std::operator<<(&local_190,"\tgl_Position = a_position;\n");
  std::operator<<(poVar1,"}\n");
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_190);
  return __return_storage_ptr__;
}

Assistant:

std::string TextureSizeCase::genVertexShader() const
{
	std::ostringstream	vert;

	vert << "#version 300 es\n"
			<< "in highp vec4 a_position;\n";

	if (m_isVertexCase)
	{
		vert << "out mediump vec4 v_color;\n";
		vert << "uniform highp " << m_samplerTypeStr << " u_sampler;\n";
		vert << "uniform highp ivec" << (m_has3DSize ? 3 : 2) << " u_texSize;\n";
		vert << "uniform highp int u_lod;\n";
	}

	vert << "void main()\n{\n";

	if (m_isVertexCase)
		vert << "	v_color = (textureSize(u_sampler, u_lod) == u_texSize ? vec4(1.0, 1.0, 1.0, 1.0) : vec4(0.0, 0.0, 0.0, 1.0));\n";

	vert << "	gl_Position = a_position;\n"
			<< "}\n";

	return vert.str();
}